

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

ssize_t __thiscall utf8stream::write(utf8stream *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  int local_230;
  int n;
  int carry;
  int next;
  uchar dst [512];
  int len_local;
  void *src_local;
  utf8stream *this_local;
  
  dst._508_4_ = SUB84(__buf,0);
  if ((((this->writing & 1U) == 0) || (CONCAT44(in_register_00000034,__fd) == 0)) ||
     (dst._508_4_ == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    for (n = 0; n < (int)dst._508_4_; n = local_230 + n) {
      local_230 = 0;
      uVar1 = encodeutf8((uchar *)&carry,0x200,
                         (uchar *)(CONCAT44(in_register_00000034,__fd) + (long)n),dst._508_4_ - n,
                         &local_230);
      if (0 < (int)uVar1) {
        uVar2 = (*this->file->_vptr_stream[10])(this->file,&carry,(ulong)uVar1);
        if (uVar2 != uVar1) {
          stopwriting(this);
          break;
        }
      }
    }
    this->pos = (long)n + this->pos;
    this_local._4_4_ = n;
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int write(const void *src, int len)
    {
        if(!writing || !src || !len) return 0;
        uchar dst[512];
        int next = 0;
        while(next < len)
        {
            int carry = 0, n = encodeutf8(dst, sizeof(dst), &((uchar *)src)[next], len - next, &carry);
            if(n > 0 && file->write(dst, n) != n) { stopwriting(); break; }
            next += carry;
        }
        pos += next;
        return next;
    }